

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void async_func_free(JSRuntime *rt,JSAsyncFunctionState *s)

{
  int *piVar1;
  int iVar2;
  JSValue JVar3;
  JSValue *pJVar4;
  
  close_var_refs(rt,&s->frame);
  pJVar4 = (s->frame).arg_buf;
  if (pJVar4 != (JSValue *)0x0) {
    for (; pJVar4 < (s->frame).cur_sp; pJVar4 = pJVar4 + 1) {
      JVar3 = *pJVar4;
      if ((0xfffffff4 < (uint)pJVar4->tag) &&
         (iVar2 = *(pJVar4->u).ptr, *(int *)(pJVar4->u).ptr = iVar2 + -1, iVar2 < 2)) {
        __JS_FreeValueRT(rt,JVar3);
      }
    }
    (*(rt->mf).js_free)(&rt->malloc_state,(s->frame).arg_buf);
  }
  pJVar4 = &(s->frame).cur_func;
  piVar1 = (int *)(pJVar4->u).ptr;
  JVar3 = *pJVar4;
  if ((0xfffffff4 < (uint)(s->frame).cur_func.tag) &&
     (iVar2 = *piVar1, *piVar1 = iVar2 + -1, iVar2 < 2)) {
    __JS_FreeValueRT(rt,JVar3);
  }
  piVar1 = (int *)(s->this_val).u.ptr;
  JVar3 = s->this_val;
  if ((0xfffffff4 < (uint)(s->this_val).tag) && (iVar2 = *piVar1, *piVar1 = iVar2 + -1, iVar2 < 2))
  {
    __JS_FreeValueRT(rt,JVar3);
    return;
  }
  return;
}

Assistant:

static void async_func_free(JSRuntime *rt, JSAsyncFunctionState *s)
{
    JSStackFrame *sf;
    JSValue *sp;

    sf = &s->frame;

    /* close the closure variables. */
    close_var_refs(rt, sf);
    
    if (sf->arg_buf) {
        /* cannot free the function if it is running */
        assert(sf->cur_sp != NULL);
        for(sp = sf->arg_buf; sp < sf->cur_sp; sp++) {
            JS_FreeValueRT(rt, *sp);
        }
        js_free_rt(rt, sf->arg_buf);
    }
    JS_FreeValueRT(rt, sf->cur_func);
    JS_FreeValueRT(rt, s->this_val);
}